

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

int __thiscall AlsaBackendFactory::init(AlsaBackendFactory *this,EVP_PKEY_CTX *ctx)

{
  void *handle;
  uint uVar1;
  undefined8 unaff_RBP;
  undefined8 uVar2;
  char *ctx_00;
  string missing_funcs;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  if ((anonymous_namespace)::alsa_handle != (void *)0x0) {
    uVar1 = 0;
    goto LAB_0015faa1;
  }
  local_30 = 0;
  local_28 = 0;
  ctx_00 = "libasound.so.2";
  local_38 = &local_28;
  handle = LoadLib("libasound.so.2");
  (anonymous_namespace)::alsa_handle = handle;
  if (handle == (void *)0x0) {
    if (1 < (int)gLogLevel) {
      init((EVP_PKEY_CTX *)ctx_00);
    }
    uVar1 = 0;
  }
  else {
    (anonymous_namespace)::psnd_strerror = GetSymbol(handle,"snd_strerror");
    if ((anonymous_namespace)::psnd_strerror == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    else {
      uVar2 = 0;
    }
    (anonymous_namespace)::psnd_pcm_open =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_open");
    if ((anonymous_namespace)::psnd_pcm_open == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_close =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_close");
    if ((anonymous_namespace)::psnd_pcm_close == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_nonblock =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_nonblock");
    if ((anonymous_namespace)::psnd_pcm_nonblock == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_frames_to_bytes =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_frames_to_bytes");
    if ((anonymous_namespace)::psnd_pcm_frames_to_bytes == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_bytes_to_frames =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_bytes_to_frames");
    if ((anonymous_namespace)::psnd_pcm_bytes_to_frames == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_malloc =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_malloc");
    if ((anonymous_namespace)::psnd_pcm_hw_params_malloc == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_free =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_free");
    if ((anonymous_namespace)::psnd_pcm_hw_params_free == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_any =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_any");
    if ((anonymous_namespace)::psnd_pcm_hw_params_any == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_current =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_current");
    if ((anonymous_namespace)::psnd_pcm_hw_params_current == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_access =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_access");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_access == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_format =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_format");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_format == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_channels =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_channels");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_channels == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_periods_near =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_periods_near");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_periods_near == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_rate_near =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_rate_near");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_rate_near == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_rate =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_rate");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_rate == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_rate_resample =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_rate_resample");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_rate_resample == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_time_near =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_buffer_time_near");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_buffer_time_near == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_period_time_near =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_period_time_near");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_period_time_near == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_buffer_size_near");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_period_size_near");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_set_buffer_size_min");
    if ((anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_min =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_buffer_time_min");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_min == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_max =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_buffer_time_max");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_max == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_period_time_min =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_period_time_min");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_period_time_min == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_period_time_max =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_period_time_max");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_period_time_max == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_buffer_size =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_buffer_size");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_buffer_size == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_period_size =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_period_size");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_period_size == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_access =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_access");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_access == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_get_periods =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_get_periods");
    if ((anonymous_namespace)::psnd_pcm_hw_params_get_periods == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_test_format =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_test_format");
    if ((anonymous_namespace)::psnd_pcm_hw_params_test_format == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params_test_channels =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params_test_channels");
    if ((anonymous_namespace)::psnd_pcm_hw_params_test_channels == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_hw_params =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_hw_params");
    if ((anonymous_namespace)::psnd_pcm_hw_params == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_sw_params_malloc =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_sw_params_malloc");
    if ((anonymous_namespace)::psnd_pcm_sw_params_malloc == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_sw_params_current =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_sw_params_current");
    if ((anonymous_namespace)::psnd_pcm_sw_params_current == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_sw_params_set_avail_min =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_sw_params_set_avail_min");
    if ((anonymous_namespace)::psnd_pcm_sw_params_set_avail_min == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_sw_params_set_stop_threshold =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_sw_params_set_stop_threshold");
    if ((anonymous_namespace)::psnd_pcm_sw_params_set_stop_threshold == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_sw_params =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_sw_params");
    if ((anonymous_namespace)::psnd_pcm_sw_params == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_sw_params_free =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_sw_params_free");
    if ((anonymous_namespace)::psnd_pcm_sw_params_free == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_prepare =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_prepare");
    if ((anonymous_namespace)::psnd_pcm_prepare == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_start =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_start");
    if ((anonymous_namespace)::psnd_pcm_start == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_resume =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_resume");
    if ((anonymous_namespace)::psnd_pcm_resume == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_reset =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_reset");
    if ((anonymous_namespace)::psnd_pcm_reset == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_wait =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_wait");
    if ((anonymous_namespace)::psnd_pcm_wait == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_delay =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_delay");
    if ((anonymous_namespace)::psnd_pcm_delay == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_state =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_state");
    if ((anonymous_namespace)::psnd_pcm_state == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_avail_update =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_avail_update");
    if ((anonymous_namespace)::psnd_pcm_avail_update == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_areas_silence =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_areas_silence");
    if ((anonymous_namespace)::psnd_pcm_areas_silence == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_mmap_begin =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_mmap_begin");
    if ((anonymous_namespace)::psnd_pcm_mmap_begin == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_mmap_commit =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_mmap_commit");
    if ((anonymous_namespace)::psnd_pcm_mmap_commit == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_readi =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_readi");
    if ((anonymous_namespace)::psnd_pcm_readi == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_writei =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_writei");
    if ((anonymous_namespace)::psnd_pcm_writei == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_drain =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_drain");
    if ((anonymous_namespace)::psnd_pcm_drain == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_drop =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_drop");
    if ((anonymous_namespace)::psnd_pcm_drop == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_recover =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_recover");
    if ((anonymous_namespace)::psnd_pcm_recover == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_info_malloc =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_info_malloc");
    if ((anonymous_namespace)::psnd_pcm_info_malloc == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_info_free =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_info_free");
    if ((anonymous_namespace)::psnd_pcm_info_free == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_info_set_device =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_info_set_device");
    if ((anonymous_namespace)::psnd_pcm_info_set_device == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_info_set_subdevice =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_info_set_subdevice");
    if ((anonymous_namespace)::psnd_pcm_info_set_subdevice == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_info_set_stream =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_info_set_stream");
    if ((anonymous_namespace)::psnd_pcm_info_set_stream == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_pcm_info_get_name =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_pcm_info_get_name");
    if ((anonymous_namespace)::psnd_pcm_info_get_name == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_pcm_next_device =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_pcm_next_device");
    if ((anonymous_namespace)::psnd_ctl_pcm_next_device == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_pcm_info =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_pcm_info");
    if ((anonymous_namespace)::psnd_ctl_pcm_info == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_open =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_open");
    if ((anonymous_namespace)::psnd_ctl_open == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_close =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_close");
    if ((anonymous_namespace)::psnd_ctl_close == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_card_info_malloc =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_card_info_malloc");
    if ((anonymous_namespace)::psnd_ctl_card_info_malloc == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_card_info_free =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_card_info_free");
    if ((anonymous_namespace)::psnd_ctl_card_info_free == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_card_info =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_card_info");
    if ((anonymous_namespace)::psnd_ctl_card_info == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_card_info_get_name =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_card_info_get_name");
    if ((anonymous_namespace)::psnd_ctl_card_info_get_name == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_ctl_card_info_get_id =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_ctl_card_info_get_id");
    if ((anonymous_namespace)::psnd_ctl_card_info_get_id == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    (anonymous_namespace)::psnd_card_next =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_card_next");
    if ((anonymous_namespace)::psnd_card_next == (void *)0x0) {
      uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    uVar1 = (uint)uVar2;
    (anonymous_namespace)::psnd_config_update_free_global =
         GetSymbol((anonymous_namespace)::alsa_handle,"snd_config_update_free_global");
    if ((anonymous_namespace)::psnd_config_update_free_global == (void *)0x0) {
      uVar1 = (uint)CONCAT71((int7)((ulong)uVar2 >> 8),1);
      std::__cxx11::string::append((char *)&local_38);
    }
    else if ((char)uVar2 == '\0') goto LAB_0015fa86;
    if (1 < (int)gLogLevel) {
      init((EVP_PKEY_CTX *)&local_38);
    }
    CloseLib((anonymous_namespace)::alsa_handle);
    (anonymous_namespace)::alsa_handle = (void *)0x0;
  }
LAB_0015fa86:
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  if (handle == (void *)0x0) {
    return 0;
  }
LAB_0015faa1:
  return uVar1 ^ 1;
}

Assistant:

bool AlsaBackendFactory::init()
{
    bool error{false};

#ifdef HAVE_DYNLOAD
    if(!alsa_handle)
    {
        std::string missing_funcs;

        alsa_handle = LoadLib("libasound.so.2");
        if(!alsa_handle)
        {
            WARN("Failed to load %s\n", "libasound.so.2");
            return ALC_FALSE;
        }

        error = ALC_FALSE;
#define LOAD_FUNC(f) do {                                                     \
    p##f = reinterpret_cast<decltype(p##f)>(GetSymbol(alsa_handle, #f));      \
    if(p##f == nullptr) {                                                     \
        error = true;                                                         \
        missing_funcs += "\n" #f;                                             \
    }                                                                         \
} while(0)
        ALSA_FUNCS(LOAD_FUNC);
#undef LOAD_FUNC

        if(error)
        {
            WARN("Missing expected functions:%s\n", missing_funcs.c_str());
            CloseLib(alsa_handle);
            alsa_handle = nullptr;
        }
    }
#endif

    return !error;
}